

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O2

bool iDynTree::transformFromAxes
               (Axis *xAxis,Axis *yAxis,Axis *zAxis,Transform *refFrame_H_frame,double tol)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  RealScalar RVar4;
  ResScalar RVar5;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_208;
  Position xyIntersectionOnX;
  Rotation rot;
  double local_1d8;
  Position *local_1d0 [7];
  undefined1 local_198 [32];
  variable_if_dynamic<long,__1> local_178;
  variable_if_dynamic<long,__1> vStack_170;
  Index local_168;
  Position yzIntersectionOnZ;
  Position yzIntersectionOnY;
  Position *local_130 [2];
  Direction zDirectionCheck;
  Position xyIntersectionOnY;
  Axis local_f0;
  Axis local_c0;
  Axis local_90;
  Axis local_60;
  
  iDynTree::Position::Position(&xyIntersectionOnX);
  iDynTree::Position::Position(&xyIntersectionOnY);
  iDynTree::Position::Position(&yzIntersectionOnY);
  iDynTree::Position::Position(&yzIntersectionOnZ);
  iDynTree::Axis::Axis(&local_60,xAxis);
  iDynTree::Axis::Axis(&local_90,yAxis);
  bVar1 = closestPoints(&local_60,&local_90,&xyIntersectionOnX,&xyIntersectionOnY,tol);
  if (bVar1) {
    iDynTree::Axis::Axis(&local_c0,yAxis);
    iDynTree::Axis::Axis(&local_f0,zAxis);
    bVar1 = closestPoints(&local_c0,&local_f0,&yzIntersectionOnY,&yzIntersectionOnZ,tol);
    if (bVar1) {
      _rot = &xyIntersectionOnX;
      local_1d0[0] = &xyIntersectionOnY;
      RVar4 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                      *)&rot);
      if ((tol < RVar4) ||
         (_rot = &yzIntersectionOnY, local_1d0[0] = &yzIntersectionOnZ,
         RVar4 = Eigen::
                 MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                 ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                         *)&rot), tol < RVar4)) {
        pcVar3 = "x and y are not incident";
      }
      else {
        _rot = &xyIntersectionOnX;
        local_1d0[0] = &yzIntersectionOnY;
        RVar4 = Eigen::
                MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                        *)&rot);
        if (RVar4 <= tol) {
          local_198._0_8_ = iDynTree::Axis::getDirection();
          local_208.
          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = (PointerType)iDynTree::Axis::getDirection();
          Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
          cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                    ((type *)&rot,local_198,
                     (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)&local_208);
          local_130[0] = (Position *)&zDirectionCheck;
          Eigen::internal::
          call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,3,1,0,3,1>>
                    ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_130
                     ,(Matrix<double,_3,_1,_0,_3,_1> *)&rot);
          iDynTree::Axis::getDirection();
          cVar2 = iDynTree::Direction::isParallel(&zDirectionCheck,tol);
          if (cVar2 == '\0') {
            pcVar3 = "x cross y is not parallel to z";
          }
          else {
            _rot = (Position *)&zDirectionCheck;
            local_198._0_8_ = iDynTree::Axis::getDirection();
            RVar5 = Eigen::internal::
                    dot_nocheck<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_false>
                    ::run((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                           *)&rot,(MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                                   *)local_198);
            if (0.0 <= RVar5) {
              iDynTree::Transform::setPosition((Position *)refFrame_H_frame);
              iDynTree::Rotation::Rotation(&rot);
              local_208.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = (PointerType)iDynTree::Axis::getDirection();
              local_178.m_value = 0;
              vStack_170.m_value = 0;
              local_168 = 1;
              local_198._0_8_ =
                   (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&rot;
              local_198._16_8_ =
                   (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&rot;
              Eigen::internal::
              call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                        ((Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
                          *)local_198,&local_208);
              local_208.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = (PointerType)iDynTree::Axis::getDirection();
              local_198._0_8_ = &local_1d8;
              local_178.m_value = 0;
              vStack_170.m_value = 1;
              local_168 = 1;
              local_198._16_8_ =
                   (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&rot;
              Eigen::internal::
              call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                        ((Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
                          *)local_198,&local_208);
              local_208.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = (PointerType)iDynTree::Axis::getDirection();
              local_198._0_8_ = local_1d0;
              local_178.m_value = 0;
              vStack_170.m_value = 2;
              local_168 = 1;
              local_198._16_8_ =
                   (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&rot;
              Eigen::internal::
              call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,3,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                        ((Block<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
                          *)local_198,&local_208);
              iDynTree::Transform::setRotation((Rotation *)refFrame_H_frame);
              return true;
            }
            pcVar3 = "x cross y is not in the same direction of z";
          }
        }
        else {
          pcVar3 = "xy intersection is not coincident with yz intersection";
        }
      }
    }
    else {
      pcVar3 = "yAxis is parallel with the zAxis";
    }
  }
  else {
    pcVar3 = "xAxis is parallel with the yAxis";
  }
  iDynTree::reportError("","transformFromAxes",pcVar3);
  return false;
}

Assistant:

bool transformFromAxes(const Axis xAxis,
                       const Axis yAxis,
                       const Axis zAxis,
                             Transform& refFrame_H_frame,
                             double tol=1e-5)
{
    // Check axis are consistent (they share the origin)
    Position xyIntersectionOnX, xyIntersectionOnY, yzIntersectionOnY, yzIntersectionOnZ;
    bool ok = closestPoints(xAxis, yAxis, xyIntersectionOnX, xyIntersectionOnY, tol);
    if (!ok)
    {
        reportError("","transformFromAxes","xAxis is parallel with the yAxis");
        return false;
    }

    ok = closestPoints(yAxis, zAxis, yzIntersectionOnY, yzIntersectionOnZ, tol);
    if (!ok)
    {
        reportError("","transformFromAxes","yAxis is parallel with the zAxis");
        return false;
    }

    if ((toEigen(xyIntersectionOnX)-toEigen(xyIntersectionOnY)).norm() > tol)
    {
        reportError("","transformFromAxes","x and y are not incident");
        return false;
    }

    if ((toEigen(yzIntersectionOnY)-toEigen(yzIntersectionOnZ)).norm() > tol)
    {
        reportError("","transformFromAxes","x and y are not incident");
        return false;
    }

    if ((toEigen(xyIntersectionOnX)-toEigen(yzIntersectionOnY)).norm() > tol)
    {
        reportError("","transformFromAxes","xy intersection is not coincident with yz intersection");
        return false;
    }

    iDynTree::Direction zDirectionCheck;
    toEigen(zDirectionCheck) = toEigen(xAxis.getDirection()).cross(toEigen(yAxis.getDirection()));
    if (!zDirectionCheck.isParallel(zAxis.getDirection(),tol))
    {
        reportError("","transformFromAxes","x cross y is not parallel to z");
        return false;
    }

    if ((toEigen(zDirectionCheck).dot(toEigen(zAxis.getDirection()))) < 0.0)
    {
        reportError("","transformFromAxes","x cross y is not in the same direction of z");
        return false;
    }

    refFrame_H_frame.setPosition(xyIntersectionOnX);
    iDynTree::Rotation rot;
    toEigen(rot).block<3,1>(0,0) = toEigen(xAxis.getDirection());
    toEigen(rot).block<3,1>(0,1) = toEigen(yAxis.getDirection());
    toEigen(rot).block<3,1>(0,2) = toEigen(zAxis.getDirection());
    refFrame_H_frame.setRotation(rot);

    return true;
}